

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int32_t zng_inflateReset2(zng_stream *strm,int32_t windowBits)

{
  internal_state *piVar1;
  int iVar2;
  uint in_ESI;
  zng_stream *in_RDI;
  inflate_state *state;
  int wrap;
  zng_stream *in_stack_ffffffffffffffd8;
  int local_18;
  uint local_14;
  int32_t local_4;
  
  iVar2 = inflateStateCheck(in_RDI);
  if (iVar2 == 0) {
    piVar1 = in_RDI->state;
    if ((int)in_ESI < 0) {
      local_18 = 0;
      if ((int)in_ESI < -0xf) {
        return -2;
      }
      local_14 = -in_ESI;
    }
    else {
      local_18 = ((int)in_ESI >> 4) + 5;
      local_14 = in_ESI;
      if ((int)in_ESI < 0x30) {
        local_14 = in_ESI & 0xf;
      }
    }
    if ((local_14 == 0) || ((7 < (int)local_14 && ((int)local_14 < 0x10)))) {
      *(int *)&piVar1->pending_out = local_18;
      piVar1->block_open = local_14;
      local_4 = zng_inflateReset(in_stack_ffffffffffffffd8);
    }
    else {
      local_4 = -2;
    }
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int32_t Z_EXPORT PREFIX(inflateReset2)(PREFIX3(stream) *strm, int32_t windowBits) {
    int wrap;
    struct inflate_state *state;

    /* get the state */
    if (inflateStateCheck(strm))
        return Z_STREAM_ERROR;
    state = (struct inflate_state *)strm->state;

    /* extract wrap request from windowBits parameter */
    if (windowBits < 0) {
        wrap = 0;
        if (windowBits < -MAX_WBITS)
            return Z_STREAM_ERROR;
        windowBits = -windowBits;
    } else {
        wrap = (windowBits >> 4) + 5;
#ifdef GUNZIP
        if (windowBits < 48)
            windowBits &= MAX_WBITS;
#endif
    }

    /* set number of window bits */
    if (windowBits && (windowBits < MIN_WBITS || windowBits > MAX_WBITS))
        return Z_STREAM_ERROR;

    /* update state and reset the rest of it */
    state->wrap = wrap;
    state->wbits = (unsigned)windowBits;
    return PREFIX(inflateReset)(strm);
}